

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O0

void __thiscall
dlib::button::set_click_handler<dlib::message_box_helper::blocking_box_win>
          (button *this,blocking_box_win *object,mfp_pointer_type event_handler_)

{
  any_function<void_(),_void,_0UL> *in_RCX;
  member_function_pointer<void,_void,_void,_void> *in_RDX;
  auto_mutex *in_RDI;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffff38;
  mfp_pointer_type in_stack_ffffffffffffff68;
  blocking_box_win *in_stack_ffffffffffffff78;
  
  auto_mutex::auto_mutex(in_RDI,in_stack_ffffffffffffff38);
  make_mfp<dlib::message_box_helper::blocking_box_win>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff68);
  any_function<void(),void,0ul>::any_function<dlib::member_function_pointer<void,void,void,void>>
            (in_RCX,in_RDX);
  any_function<void_(),_void,_0UL>::operator=(in_RCX,(any_function<void_(),_void,_0UL> *)in_RDX);
  any_function<void_(),_void,_0UL>::~any_function((any_function<void_(),_void,_0UL> *)0x457890);
  member_function_pointer<void,_void,_void,_void>::~member_function_pointer
            ((member_function_pointer<void,_void,_void,_void> *)0x45789a);
  any_function<void_(dlib::button_&),_void,_1UL>::clear
            ((any_function<void_(dlib::button_&),_void,_1UL> *)0x4578ab);
  auto_mutex::~auto_mutex((auto_mutex *)0x4578b8);
  return;
}

Assistant:

void set_click_handler (
            T& object,
            void (T::*event_handler_)()
        )
        {
            auto_mutex M(m);
            event_handler = make_mfp(object,event_handler_);
            event_handler_self.clear();
        }